

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
::try_emplace_impl<unsigned_long_const&>
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          *this,unsigned_long *k)

{
  long lVar1;
  undefined1 auVar2 [16];
  size_t i;
  size_t hashval;
  pair<unsigned_long,_bool> pVar3;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *k;
  hashval = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,8) +
            SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,0);
  pVar3 = raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::find_or_prepare_insert<unsigned_long>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      *)this,k,hashval);
  i = pVar3.first;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar1 = *(long *)(this + 8);
    *(unsigned_long *)(lVar1 + i * 0x10) = *k;
    *(undefined8 *)(lVar1 + 8 + i * 0x10) = 0;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                *)this,i,(byte)hashval & 0x7f);
  }
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)this + i);
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(i * 0x10 + lVar1);
  __return_storage_ptr__->second = pVar3.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
			{
				size_t hashval = this->hash(k);
				auto res = this->find_or_prepare_insert(k, hashval);
				if (res.second) {
					this->emplace_at(res.first, std::piecewise_construct,
					                 std::forward_as_tuple(std::forward<K>(k)),
					                 std::forward_as_tuple(std::forward<Args>(args)...));
					this->set_ctrl(res.first, H2(hashval));
				}
				return {this->iterator_at(res.first), res.second};
			}